

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTport.c
# Opt level: O2

void sbfTportFirstDestroyStreamCb(int fd,short events,void *closure)

{
  sbfPub pub;
  sbfSub sub;
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  anon_struct_16_2_4dd83919_for_mEntry *paVar5;
  long lVar6;
  anon_struct_16_2_4dd83919_for_mEntry *paVar7;
  bool bVar8;
  
  lVar2 = *closure;
  sbfLog_log(*(undefined8 *)(lVar2 + 8),0,"first destroy callback for stream %p");
  plVar1 = (long *)(lVar2 + 0x170);
  while( true ) {
    lVar6 = *plVar1;
    if (lVar6 == 0) {
      uVar3 = *(undefined8 *)(lVar2 + 8);
      sbfLog_log(uVar3,0,"stream %p has already been destroyed",*(undefined8 *)((long)closure + 8));
      sbfTportSecondDestroyStreamCb((int)uVar3,0,closure);
      return;
    }
    if (lVar6 == *(long *)((long)closure + 8)) break;
    plVar1 = (long *)(lVar6 + 0x50);
  }
  plVar1 = (long *)(lVar6 + 0x20);
  lVar2 = 0;
  do {
    lVar6 = lVar2;
    lVar2 = *plVar1;
    plVar1 = (long *)(lVar2 + 0x50);
  } while (lVar2 != 0);
  do {
    if (lVar6 == 0) {
      sbfMw_enqueueThread(*(undefined8 *)((long)closure + 0x10),(long)closure + 0x18,
                          sbfTportSecondDestroyStreamCb,closure);
      return;
    }
    lVar2 = *(long *)(lVar6 + 0x58);
    if (*(long *)(lVar6 + 0x58) == 0) {
      lVar4 = *(long *)(lVar6 + 0x60);
      lVar2 = lVar6;
      if ((lVar4 == 0) || (*(long *)(lVar4 + 0x50) != lVar6)) {
        do {
          lVar4 = *(long *)(lVar2 + 0x60);
          if (lVar4 == 0) {
            lVar4 = 0;
            break;
          }
          bVar8 = lVar2 == *(long *)(lVar4 + 0x58);
          lVar2 = lVar4;
        } while (bVar8);
      }
    }
    else {
      do {
        lVar4 = lVar2;
        lVar2 = *(long *)(lVar4 + 0x50);
      } while (*(long *)(lVar4 + 0x50) != 0);
    }
    paVar7 = (anon_struct_16_2_4dd83919_for_mEntry *)(lVar6 + 8);
    while (pub = paVar7->tqe_next, pub != (sbfPub)0x0) {
      sbfPub_destroy(pub);
      paVar7 = &pub->mEntry;
    }
    paVar5 = (anon_struct_16_2_4dd83919_for_mEntry *)(lVar6 + 0x18);
    while (sub = paVar5->tqe_next, lVar6 = lVar4, sub != (sbfSub)0x0) {
      sbfSub_destroy(sub);
      paVar5 = &sub->mEntry;
    }
  } while( true );
}

Assistant:

static void
sbfTportFirstDestroyStreamCb (int fd, short events, void* closure)
{
    sbfTportDestroyStreamClosure* closure0 = closure;
    sbfTportStream                tstream;
    sbfTport                      tport = closure0->mTport;
    sbfTportTopic                 ttopic;
    sbfTportTopic                 ttopic1;
    sbfPub                        pub;
    sbfSub                        sub;

    sbfLog_debug (tport->mLog,
                  "first destroy callback for stream %p",
                  closure0->mTportStream);

    /*
     * Removing pubs or subs may already have disposed of the stream so check
     * if it's still on the transport's list.
     */
    TAILQ_FOREACH (tstream, &tport->mStreams, mEntry)
    {
        if (tstream == closure0->mTportStream)
            break;
    }

    if (tstream == NULL)
    {
        sbfLog_debug (tport->mLog,
                      "stream %p has already been destroyed",
                      closure0->mTportStream);
        sbfTportSecondDestroyStreamCb (fd, events, closure);
        return;
    }

    RB_FOREACH_SAFE (ttopic, sbfTportTopicTreeImpl, &tstream->mTopics, ttopic1)
    {
        TAILQ_FOREACH (pub, &ttopic->mPubs, mEntry)
            sbfPub_destroy (pub);
        TAILQ_FOREACH (sub, &ttopic->mSubs, mEntry)
            sbfSub_destroy (sub);
    }

    /*
     * Queue to wakeup after the publisher and subscriber events (which will
     * have freed and removed the stream).
     */
    sbfMw_enqueueThread (closure0->mThread,
                         &closure0->mEvent,
                         sbfTportSecondDestroyStreamCb,
                         closure0);
}